

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

void Sbd_ManStop(Sbd_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  long lVar5;
  long lVar6;
  
  pVVar1 = p->vTfos;
  if (0 < pVVar1->nCap) {
    lVar6 = 8;
    lVar5 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar6);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar6) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < pVVar1->nCap);
  }
  if (pVVar1->pArray != (Vec_Int_t *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (Vec_Int_t *)0x0;
  }
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  free(pVVar1);
  pVVar3 = p->vLutLevs;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vLutCuts;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vMirrors;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  lVar5 = 7;
  do {
    pVVar4 = p->vSims[lVar5 + -7];
    if (pVVar4->pArray != (word *)0x0) {
      free(pVVar4->pArray);
      pVVar4->pArray = (word *)0x0;
    }
    if (pVVar4 != (Vec_Wrd_t *)0x0) {
      free(pVVar4);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  pVVar3 = p->vCover;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vLits;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vLits2;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vRoots;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vWinObjs;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vObj2Var;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vDivSet;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vDivVars;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vDivValues;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar1 = p->vDivLevels;
  if (0 < pVVar1->nCap) {
    lVar6 = 8;
    lVar5 = 0;
    do {
      pvVar2 = *(void **)((long)&pVVar1->pArray->nCap + lVar6);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)&pVVar1->pArray->nCap + lVar6) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar5 < pVVar1->nCap);
  }
  if (pVVar1->pArray != (Vec_Int_t *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (Vec_Int_t *)0x0;
  }
  pVVar1->nCap = 0;
  pVVar1->nSize = 0;
  free(pVVar1);
  pVVar3 = p->vCounts[0];
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vCounts[1];
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar4 = p->vMatrix;
  if (pVVar4->pArray != (word *)0x0) {
    free(pVVar4->pArray);
    pVVar4->pArray = (word *)0x0;
  }
  if (pVVar4 != (Vec_Wrd_t *)0x0) {
    free(pVVar4);
  }
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  p->pSat = (sat_solver *)0x0;
  if (p->pSto != (Sbd_Sto_t *)0x0) {
    Sbd_StoFree(p->pSto);
  }
  if (p->pSrv != (Sbd_Srv_t *)0x0) {
    Sbd_ManCutServerStop(p->pSrv);
  }
  if (p != (Sbd_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Sbd_ManStop( Sbd_Man_t * p )
{
    int i;
    Vec_WecFree( p->vTfos );
    Vec_IntFree( p->vLutLevs );
    Vec_IntFree( p->vLutCuts );
    Vec_IntFree( p->vMirrors );
    for ( i = 0; i < 4; i++ )
        Vec_WrdFree( p->vSims[i] );
    Vec_IntFree( p->vCover );
    Vec_IntFree( p->vLits );
    Vec_IntFree( p->vLits2 );
    Vec_IntFree( p->vRoots );
    Vec_IntFree( p->vWinObjs );
    Vec_IntFree( p->vObj2Var );
    Vec_IntFree( p->vDivSet );
    Vec_IntFree( p->vDivVars );
    Vec_IntFree( p->vDivValues );
    Vec_WecFree( p->vDivLevels );
    Vec_IntFree( p->vCounts[0] );
    Vec_IntFree( p->vCounts[1] );
    Vec_WrdFree( p->vMatrix );
    sat_solver_delete_p( &p->pSat );
    if ( p->pSto ) Sbd_StoFree( p->pSto );
    if ( p->pSrv ) Sbd_ManCutServerStop( p->pSrv );
    ABC_FREE( p );
}